

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalScheduling.cpp
# Opt level: O0

void __thiscall IntervalScheduler::computeSchedule(IntervalScheduler *this)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  long *in_RDI;
  double scoreIfIgnored;
  double scoreIfChosen;
  size_t j;
  value_type local_20;
  double local_18;
  ulong local_10;
  
  for (local_10 = 1; local_10 < *in_RDI + 1U; local_10 = local_10 + 1) {
    pvVar2 = std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::operator[]
                       ((vector<WeightedInterval,_std::allocator<WeightedInterval>_> *)(in_RDI + 1),
                        local_10);
    dVar1 = pvVar2->score;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 7),
                        local_10);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),*pvVar3);
    local_18 = dVar1 + *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),local_10 - 1);
    local_20 = *pvVar4;
    pdVar5 = std::max<double>(&local_18,&local_20);
    dVar1 = *pdVar5;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),local_10);
    *pvVar4 = dVar1;
  }
  return;
}

Assistant:

void IntervalScheduler::computeSchedule() {

    for (size_t j = 1; j < n+1; j++) {
        double scoreIfChosen = ivals[j].score + bestGeneScore[p[j]];
        double scoreIfIgnored = bestGeneScore[j-1];

        bestGeneScore[j] = max(scoreIfChosen, scoreIfIgnored);
    } 
}